

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

string * __thiscall
t_netstd_generator::base_type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_netstd_generator *this,t_base_type *tbase)

{
  int iVar1;
  char *pcVar2;
  undefined1 auVar3 [12];
  string sStack_38;
  
  switch(tbase->base_) {
  case TYPE_VOID:
    pcVar2 = "void";
    break;
  case TYPE_STRING:
    iVar1 = (*(tbase->super_t_type).super_t_doc._vptr_t_doc[7])(tbase);
    if ((char)iVar1 == '\0') {
      pcVar2 = "string";
    }
    else {
      pcVar2 = "byte[]";
    }
    break;
  case TYPE_BOOL:
    pcVar2 = "bool";
    break;
  case TYPE_I8:
    pcVar2 = "sbyte";
    break;
  case TYPE_I16:
    pcVar2 = "short";
    break;
  case TYPE_I32:
    pcVar2 = "int";
    break;
  case TYPE_I64:
    pcVar2 = "long";
    break;
  case TYPE_DOUBLE:
    pcVar2 = "double";
    break;
  default:
    auVar3 = __cxa_allocate_exception(0x20);
    t_base_type::t_base_name_abi_cxx11_(&sStack_38,(t_base_type *)(ulong)tbase->base_,auVar3._8_4_);
    std::operator+(auVar3._0_8_,"compiler error: no C# name for base type ",&sStack_38);
    __cxa_throw(auVar3._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(allocator *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

string t_netstd_generator::base_type_name(t_base_type* tbase)
{
    switch (tbase->get_base())
    {
    case t_base_type::TYPE_VOID:
        return "void";
    case t_base_type::TYPE_STRING:
        if (tbase->is_binary())
        {
            return "byte[]";
        } else {
            return "string";
        }
    case t_base_type::TYPE_BOOL:
        return "bool";
    case t_base_type::TYPE_I8:
        return "sbyte";
    case t_base_type::TYPE_I16:
        return "short";
    case t_base_type::TYPE_I32:
        return "int";
    case t_base_type::TYPE_I64:
        return "long";
    case t_base_type::TYPE_DOUBLE:
        return "double";
    default:
        throw "compiler error: no C# name for base type " + t_base_type::t_base_name(tbase->get_base());
    }
}